

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Map * __thiscall World::GetMap(World *this,short id)

{
  pointer ppMVar1;
  undefined8 uVar2;
  long *plVar3;
  long *plVar4;
  Map *pMVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  undefined1 auVar7 [12];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar6 = (ulong)((int)CONCAT62(in_register_00000032,id) + -1);
  ppMVar1 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppMVar1 >> 3)) {
    pMVar5 = ppMVar1[uVar6];
  }
  else {
    uVar2 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    __cxa_begin_catch(uVar2);
    ppMVar1 = (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
        super__Vector_impl_data._M_finish == ppMVar1) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      __cxa_begin_catch(uVar2);
      auVar7 = __cxa_allocate_exception(0x10);
      util::to_string_abi_cxx11_
                (&local_60,(util *)(CONCAT62(in_register_00000032,id) & 0xffffffff),auVar7._8_4_);
      std::operator+(&local_40,"Map #",&local_60);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_80 = (long *)*plVar3;
      plVar4 = plVar3 + 2;
      if (local_80 == plVar4) {
        local_70 = *plVar4;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar4;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(auVar7._0_8_,(string *)&local_80);
      __cxa_throw(auVar7._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pMVar5 = *ppMVar1;
    __cxa_end_catch();
  }
  return pMVar5;
}

Assistant:

Map *World::GetMap(short id)
{
	try
	{
		return this->maps.at(id - 1);
	}
	catch (...)
	{
		try
		{
			return this->maps.at(0);
		}
		catch (...)
		{
			throw std::runtime_error("Map #" + util::to_string(id) + " and fallback map #1 are unavailable");
		}
	}
}